

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O0

double sampleSurfaceNoise(SurfaceNoise *sn,int x,int y,int z)

{
  double dVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  double *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double in_stack_00000008;
  int i;
  double ty;
  double sy;
  double dz;
  double dy;
  double dx;
  double contrib;
  double persist;
  double mainNoise;
  double maxNoise;
  double minNoise;
  double yStep;
  double xzStep;
  double yScale;
  double xzScale;
  double in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar5;
  double in_stack_ffffffffffffff78;
  double local_58;
  
  dVar2 = *in_RDI * 684.412;
  dVar3 = in_RDI[1] * 684.412;
  dVar4 = in_RDI[2];
  dVar1 = in_RDI[3];
  local_58 = 1.0;
  for (iVar5 = 0; iVar5 < 0x10; iVar5 = iVar5 + 1) {
    maintainPrecision((double)in_ESI * dVar2 * local_58);
    maintainPrecision((double)in_EDX * dVar3 * local_58);
    maintainPrecision((double)in_ECX * dVar2 * local_58);
    in_stack_ffffffffffffff78 = (double)in_EDX * dVar3 * local_58;
    samplePerlin((PerlinNoise *)dx,dy,dz,sy,ty,in_stack_00000008);
    samplePerlin((PerlinNoise *)dx,dy,dz,sy,ty,in_stack_00000008);
    if (iVar5 < 8) {
      maintainPrecision((double)in_ESI * (dVar2 / dVar4) * local_58);
      maintainPrecision((double)in_EDX * (dVar3 / dVar1) * local_58);
      maintainPrecision((double)in_ECX * (dVar2 / dVar4) * local_58);
      in_stack_ffffffffffffff78 = (double)in_EDX * (dVar3 / dVar1) * local_58;
      samplePerlin((PerlinNoise *)dx,dy,dz,sy,ty,in_stack_00000008);
    }
    local_58 = local_58 * 0.5;
  }
  dVar4 = clampedLerp(in_stack_ffffffffffffff78,(double)CONCAT44(iVar5,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
  return dVar4;
}

Assistant:

double sampleSurfaceNoise(const SurfaceNoise *sn, int x, int y, int z)
{
    double xzScale = 684.412 * sn->xzScale;
    double yScale = 684.412 * sn->yScale;
    double xzStep = xzScale / sn->xzFactor;
    double yStep = yScale / sn->yFactor;

    double minNoise = 0;
    double maxNoise = 0;
    double mainNoise = 0;
    double persist = 1.0;
    double contrib = 1.0;
    double dx, dy, dz, sy, ty;
    int i;

    for (i = 0; i < 16; i++)
    {
        dx = maintainPrecision(x * xzScale * persist);
        dy = maintainPrecision(y * yScale  * persist);
        dz = maintainPrecision(z * xzScale * persist);
        sy = yScale * persist;
        ty = y * sy;

        minNoise += samplePerlin(&sn->octmin.octaves[i], dx, dy, dz, sy, ty) * contrib;
        maxNoise += samplePerlin(&sn->octmax.octaves[i], dx, dy, dz, sy, ty) * contrib;

        if (i < 8)
        {
            dx = maintainPrecision(x * xzStep * persist);
            dy = maintainPrecision(y * yStep  * persist);
            dz = maintainPrecision(z * xzStep * persist);
            sy = yStep * persist;
            ty = y * sy;
            mainNoise += samplePerlin(&sn->octmain.octaves[i], dx, dy, dz, sy, ty) * contrib;
        }
        persist *= 0.5;
        contrib *= 2.0;
    }

    return clampedLerp(0.5 + 0.05*mainNoise, minNoise/512.0, maxNoise/512.0);
}